

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ProgramOptions::generateExample(ProgramOptions *this)

{
  shared_ptr<DataSet> ds;
  string *in_stack_000001f8;
  DataSet *in_stack_00000200;
  allocator local_39;
  string local_38 [56];
  
  DataSet::random();
  std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x104270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"example.kmd",&local_39);
  DataSet::toFile(in_stack_00000200,in_stack_000001f8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::shared_ptr<DataSet>::~shared_ptr((shared_ptr<DataSet> *)0x1042cb);
  return;
}

Assistant:

void generateExample() {
    auto ds = DataSet::random(features, vectors, clusters);
    ds->toFile("example.kmd");
  }